

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

void __thiscall QString::resize(QString *this,qsizetype newSize,QChar fillChar)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  char16_t local_1a;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (this->d).size;
  local_1a = fillChar.ucs;
  resize(this,newSize);
  lVar2 = (this->d).size;
  lVar3 = lVar2 - lVar1;
  if (lVar3 != 0 && lVar1 <= lVar2) {
    std::__fill_n_a<char16_t*,long_long,char16_t>((this->d).ptr + lVar1,lVar3,&local_1a);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QString::resize(qsizetype newSize, QChar fillChar)
{
    const qsizetype oldSize = size();
    resize(newSize);
    const qsizetype difference = size() - oldSize;
    if (difference > 0)
        std::fill_n(d.data() + oldSize, difference, fillChar.unicode());
}